

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapperTree.c
# Opt level: O0

int Map_LibraryDeriveGateInfo(Map_SuperLib_t *pLib,st__table *tExcludeGate)

{
  float fVar1;
  Map_Super_t *pGate_00;
  Map_Super_t *pMVar2;
  int iVar3;
  char *key;
  double dVar4;
  float local_98;
  float local_94;
  int local_80;
  int nRealVars;
  int k;
  int i;
  uint uTruths [6] [2];
  uint local_40 [2];
  uint uCanon [2];
  Mio_Pin_t *pPin;
  Map_Super_t *pFanin;
  Map_Super_t *pGate;
  st__table *tExcludeGate_local;
  Map_SuperLib_t *pLib_local;
  
  nRealVars = pLib->nVarsMax;
  while( true ) {
    if (pLib->nLines <= nRealVars) {
      Map_SuperTableSortSupergatesByDelay(pLib->tTableC,pLib->nSupersAll);
      return 1;
    }
    pGate_00 = pLib->ppSupers[nRealVars];
    if (tExcludeGate != (st__table *)0x0) {
      key = Mio_GateReadName(pGate_00->pRoot);
      iVar3 = st__lookup(tExcludeGate,key,(char **)0x0);
      if (iVar3 != 0) {
        *(uint *)&pGate_00->field_0x4 = *(uint *)&pGate_00->field_0x4 & 0xfffffffd | 2;
      }
      for (local_80 = 0; local_80 < (int)(*(uint *)&pGate_00->field_0x4 >> 2 & 7);
          local_80 = local_80 + 1) {
        if ((*(uint *)&pGate_00->pFanins[local_80]->field_0x4 >> 1 & 1) != 0) {
          *(uint *)&pGate_00->field_0x4 = *(uint *)&pGate_00->field_0x4 & 0xfffffffd | 2;
        }
      }
    }
    for (local_80 = 0; local_80 < (int)(*(uint *)&pGate_00->field_0x4 >> 2 & 7);
        local_80 = local_80 + 1) {
      pMVar2 = pGate_00->pFanins[local_80];
      (&k)[(long)local_80 * 2] = pMVar2->uTruth[0];
      uTruths[(long)local_80 + -1][1] = pMVar2->uTruth[1];
    }
    Mio_DeriveTruthTable
              (pGate_00->pRoot,(uint (*) [2])&k,*(uint *)&pGate_00->field_0x4 >> 2 & 7,6,
               pGate_00->uTruth);
    for (local_80 = 0; local_80 < pLib->nVarsMax; local_80 = local_80 + 1) {
      pGate_00->tDelaysR[local_80].Fall = -9999.0;
      pGate_00->tDelaysR[local_80].Rise = -9999.0;
      pGate_00->tDelaysF[local_80].Fall = -9999.0;
      pGate_00->tDelaysF[local_80].Rise = -9999.0;
    }
    uCanon = (uint  [2])Mio_GateReadPins(pGate_00->pRoot);
    local_80 = 0;
    while (local_80 < (int)(*(uint *)&pGate_00->field_0x4 >> 2 & 7)) {
      if (uCanon == (uint  [2])0x0) {
        printf("There are less pins than gate inputs.\n");
        return 0;
      }
      Map_LibraryAddFaninDelays(pLib,pGate_00,pGate_00->pFanins[local_80],(Mio_Pin_t *)uCanon);
      local_80 = local_80 + 1;
      uCanon = (uint  [2])Mio_PinReadNext((Mio_Pin_t *)uCanon);
    }
    if (uCanon != (uint  [2])0x0) break;
    (pGate_00->tDelayMax).Fall = -9999.0;
    (pGate_00->tDelayMax).Rise = -9999.0;
    for (local_80 = 0; local_80 < pLib->nVarsMax; local_80 = local_80 + 1) {
      if ((pGate_00->tDelayMax).Rise < pGate_00->tDelaysR[local_80].Rise) {
        (pGate_00->tDelayMax).Rise = pGate_00->tDelaysR[local_80].Rise;
      }
      if ((pGate_00->tDelayMax).Rise < pGate_00->tDelaysR[local_80].Fall) {
        (pGate_00->tDelayMax).Rise = pGate_00->tDelaysR[local_80].Fall;
      }
      if ((pGate_00->tDelayMax).Fall < pGate_00->tDelaysF[local_80].Rise) {
        (pGate_00->tDelayMax).Fall = pGate_00->tDelaysF[local_80].Rise;
      }
      if ((pGate_00->tDelayMax).Fall < pGate_00->tDelaysF[local_80].Fall) {
        (pGate_00->tDelayMax).Fall = pGate_00->tDelaysF[local_80].Fall;
      }
      fVar1 = pGate_00->tDelaysF[local_80].Fall;
      if (fVar1 < pGate_00->tDelaysF[local_80].Rise || fVar1 == pGate_00->tDelaysF[local_80].Rise) {
        local_94 = pGate_00->tDelaysF[local_80].Rise;
      }
      else {
        local_94 = pGate_00->tDelaysF[local_80].Fall;
      }
      pGate_00->tDelaysF[local_80].Worst = local_94;
      fVar1 = pGate_00->tDelaysR[local_80].Fall;
      if (fVar1 < pGate_00->tDelaysR[local_80].Rise || fVar1 == pGate_00->tDelaysR[local_80].Rise) {
        local_98 = pGate_00->tDelaysR[local_80].Rise;
      }
      else {
        local_98 = pGate_00->tDelaysR[local_80].Fall;
      }
      pGate_00->tDelaysR[local_80].Worst = local_98;
    }
    *(uint *)&pGate_00->field_0x4 = *(uint *)&pGate_00->field_0x4 & 0xffffff1f | 0x20;
    dVar4 = Mio_GateReadArea(pGate_00->pRoot);
    pGate_00->Area = (float)dVar4;
    for (local_80 = 0; local_80 < (int)(*(uint *)&pGate_00->field_0x4 >> 2 & 7);
        local_80 = local_80 + 1) {
      *(uint *)&pGate_00->field_0x4 =
           *(uint *)&pGate_00->field_0x4 & 0xffffff1f |
           ((*(uint *)&pGate_00->field_0x4 >> 5 & 7) +
            (*(uint *)&pGate_00->pFanins[local_80]->field_0x4 >> 5 & 7) & 7) << 5;
      pGate_00->Area = pGate_00->pFanins[local_80]->Area + pGate_00->Area;
    }
    if (((*(uint *)&pGate_00->field_0x4 & 1) != 0) &&
       ((*(uint *)&pGate_00->field_0x4 >> 1 & 1) == 0)) {
      iVar3 = Map_LibraryGetMaxSuperPi_rec(pGate_00);
      iVar3 = iVar3 + 1;
      if ((iVar3 < 1) || (pLib->nVarsMax < iVar3)) {
        __assert_fail("nRealVars > 0 && nRealVars <= pLib->nVarsMax",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/mapper/mapperTree.c"
                      ,0x2af,"int Map_LibraryDeriveGateInfo(Map_SuperLib_t *, st__table *)");
      }
      iVar3 = Map_CanonComputeSlow
                        (pLib->uTruths,pLib->nVarsMax,iVar3,pGate_00->uTruth,pGate_00->uPhases,
                         local_40);
      *(uint *)&pGate_00->field_0x4 = *(uint *)&pGate_00->field_0x4 & 0xfffffff | iVar3 << 0x1c;
      Map_SuperTableInsertC(pLib->tTableC,local_40,pGate_00);
    }
    nRealVars = nRealVars + 1;
  }
  printf("There are more pins than gate inputs.\n");
  return 0;
}

Assistant:

int Map_LibraryDeriveGateInfo( Map_SuperLib_t * pLib, st__table * tExcludeGate )
{
    Map_Super_t * pGate, * pFanin;
    Mio_Pin_t * pPin;
    unsigned uCanon[2];
    unsigned uTruths[6][2];
    int i, k, nRealVars;

    // set all the derivable info related to the supergates
    for ( i = pLib->nVarsMax; i < (int)pLib->nLines; i++ )
    {
        pGate = pLib->ppSupers[i];

        if ( tExcludeGate )
        {
            if ( st__is_member( tExcludeGate, Mio_GateReadName( pGate->pRoot ) ) )
                pGate->fExclude = 1;
            for ( k = 0; k < (int)pGate->nFanins; k++ )
            {
                pFanin = pGate->pFanins[k];
                if ( pFanin->fExclude )
                {
                    pGate->fExclude = 1;
                    continue;
                }
            }
        }
        
        // collect the truth tables of the fanins
        for ( k = 0; k < (int)pGate->nFanins; k++ )
        {
            pFanin = pGate->pFanins[k];
            uTruths[k][0] = pFanin->uTruth[0];
            uTruths[k][1] = pFanin->uTruth[1];
        }
        // derive the new truth table
        Mio_DeriveTruthTable( pGate->pRoot, uTruths, pGate->nFanins, 6, pGate->uTruth );

        // set the initial delays of the supergate
        for ( k = 0; k < pLib->nVarsMax; k++ )
        {
            pGate->tDelaysR[k].Rise = pGate->tDelaysR[k].Fall = MAP_NO_VAR;
            pGate->tDelaysF[k].Rise = pGate->tDelaysF[k].Fall = MAP_NO_VAR;
        }
        // get the linked list of pins for the given root gate
        pPin = Mio_GateReadPins( pGate->pRoot );
        // update the initial delay of the supergate using info from the corresponding pin
        for ( k = 0; k < (int)pGate->nFanins; k++, pPin = Mio_PinReadNext(pPin) )
        {
            // if there is no corresponding pin, this is a bug, return fail
            if ( pPin == NULL )
            {
                printf( "There are less pins than gate inputs.\n" );
                return 0;
            }
            // update the delay information of k-th fanins info from the corresponding pin
            Map_LibraryAddFaninDelays( pLib, pGate, pGate->pFanins[k], pPin );
        }
        // if there are some pins left, this is a bug, return fail
        if ( pPin != NULL )
        {
            printf( "There are more pins than gate inputs.\n" );
            return 0;
        }
        // find the max delay
        pGate->tDelayMax.Rise = pGate->tDelayMax.Fall = MAP_NO_VAR;
        for ( k = 0; k < pLib->nVarsMax; k++ )
        {
            // the rise of the output depends on the rise and fall of the output
            if ( pGate->tDelayMax.Rise < pGate->tDelaysR[k].Rise )
                pGate->tDelayMax.Rise = pGate->tDelaysR[k].Rise;
            if ( pGate->tDelayMax.Rise < pGate->tDelaysR[k].Fall )
                pGate->tDelayMax.Rise = pGate->tDelaysR[k].Fall;
            // the fall of the output depends on the rise and fall of the output
            if ( pGate->tDelayMax.Fall < pGate->tDelaysF[k].Rise )
                pGate->tDelayMax.Fall = pGate->tDelaysF[k].Rise;
            if ( pGate->tDelayMax.Fall < pGate->tDelaysF[k].Fall )
                pGate->tDelayMax.Fall = pGate->tDelaysF[k].Fall;

            pGate->tDelaysF[k].Worst = MAP_MAX( pGate->tDelaysF[k].Fall, pGate->tDelaysF[k].Rise );
            pGate->tDelaysR[k].Worst = MAP_MAX( pGate->tDelaysR[k].Fall, pGate->tDelaysR[k].Rise );
        }

        // count gates and area of the supergate
        pGate->nGates = 1;
        pGate->Area   = (float)Mio_GateReadArea(pGate->pRoot);
        for ( k = 0; k < (int)pGate->nFanins; k++ )
        {
            pGate->nGates += pGate->pFanins[k]->nGates;
            pGate->Area   += pGate->pFanins[k]->Area;
        }
        // do not add the gate to the table, if this gate is an internal gate
        // of some supegate and does not correspond to a supergate output
        if ( ( !pGate->fSuper ) || pGate->fExclude )
            continue;

        // find the maximum index of a variable in the support of the supergates
        // this is important for two reasons:
        // (1) to limit the number of permutations considered for canonicization
        // (2) to get rid of equivalence phases to speed-up matching
        nRealVars = Map_LibraryGetMaxSuperPi_rec( pGate ) + 1;
        assert( nRealVars > 0 && nRealVars <= pLib->nVarsMax );
        // if there are some problems with this code, try this instead
//        nRealVars = pLib->nVarsMax;

        // find the N-canonical form of this supergate
        pGate->nPhases = Map_CanonComputeSlow( pLib->uTruths, pLib->nVarsMax, nRealVars, pGate->uTruth, pGate->uPhases, uCanon );
        // add the supergate into the table by its N-canonical table
        Map_SuperTableInsertC( pLib->tTableC, uCanon, pGate );
/*
        {
            int uCanon1, uCanon2;
            uCanon1 = uCanon[0];
            pGate->uTruth[0] = ~pGate->uTruth[0];
            pGate->uTruth[1] = ~pGate->uTruth[1];
            Map_CanonComputeSlow( pLib->uTruths, pLib->nVarsMax, nRealVars, pGate->uTruth, pGate->uPhases, uCanon );
            uCanon2 = uCanon[0];
Rwt_Man5ExploreCount( uCanon1 < uCanon2 ? uCanon1 : uCanon2 );
        }
*/
    }
    // sort the gates in each line
    Map_SuperTableSortSupergatesByDelay( pLib->tTableC, pLib->nSupersAll );

    // let the glory be manifest
//    Map_LibraryPrintTree( pLib );
    return 1;
}